

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_AddXssSafeModifier::Run(void)

{
  ulong uVar1;
  TemplateModifier *esc_fn;
  
  uVar1 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddXssSafeModifier(\"x-asafetest\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddXssSafeModifier(\"x-asafetest-arg=\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddXssSafeModifier(\"x-asafetest-arg=h\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier("test",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddXssSafeModifier(\"test\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddXssSafeModifier(\"x-asafetest\", esc_fn))"
           );
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddXssSafeModifier(\"x-asafetest-arg=\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddXssSafeModifier(\"x-asafetest-arg=h\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-safetest2\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-safetest2-arg=\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-safetest2-arg=h\", esc_fn)");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddXssSafeModifier(\"x-safetest2\", esc_fn))"
           );
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddXssSafeModifier(\"x-safetest2-arg=\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddXssSafeModifier
                    ("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddXssSafeModifier(\"x-safetest2-arg=h\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddModifier(\"x-asafetest\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddModifier(\"x-asafetest-arg=\", esc_fn))");
    exit(1);
  }
  uVar1 = ctemplate::AddModifier("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar1 & 1) == 0) {
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","!(ctemplate::AddModifier(\"x-asafetest-arg=h\", esc_fn))");
  exit(1);
}

Assistant:

TEST(TemplateModifiers, AddXssSafeModifier) {
  // For shorter lines.
  const GOOGLE_NAMESPACE::TemplateModifier* esc_fn =
      &GOOGLE_NAMESPACE::html_escape;

  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h", esc_fn));

  // Make sure AddXssSafeModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("test", esc_fn));

  // Make sure AddXssSafeModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h",
                                             esc_fn));

  // Make sure AddXssSafeModifier fails if the same modifier was
  // previously added via AddModifier.
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=h", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=h", esc_fn));

  // and vice versa.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=h", esc_fn));
}